

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O0

int Mio_LibraryCompareGatesByName(Mio_Gate_t **pp1,Mio_Gate_t **pp2)

{
  int iVar1;
  int Diff;
  Mio_Gate_t **pp2_local;
  Mio_Gate_t **pp1_local;
  
  iVar1 = strcmp((*pp1)->pName,(*pp2)->pName);
  if (iVar1 < 0) {
    pp1_local._4_4_ = -1;
  }
  else if (iVar1 < 1) {
    pp1_local._4_4_ = 0;
  }
  else {
    pp1_local._4_4_ = 1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Mio_LibraryCompareGatesByName( Mio_Gate_t ** pp1, Mio_Gate_t ** pp2 )
{
    int Diff = strcmp( (*pp1)->pName, (*pp2)->pName );
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}